

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Text::Reader> expected)

{
  Exception *__s1;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Fault f;
  Reader local_70;
  Builder local_60;
  Exception *local_48;
  CapTableBuilder *pCStack_40;
  
  uVar5 = expected._M_len;
  if (reader.builder.elementCount == uVar5) {
    if (uVar5 != 0) {
      local_48 = (Exception *)reader.builder.segment;
      pCStack_40 = reader.builder.capTable;
      uVar3 = 0;
      uVar4 = 1;
      do {
        __s1 = (Exception *)expected._M_array[uVar3].super_StringPtr.content.ptr;
        sVar1 = expected._M_array[uVar3].super_StringPtr.content.size_;
        f.exception = local_48;
        PointerBuilder::getBlob<capnp::Text>(&local_60,(PointerBuilder *)&f,(void *)0x0,0);
        local_70.super_StringPtr.content.ptr = local_60.content.ptr;
        local_70.super_StringPtr.content.size_ = local_60.content.size_;
        f.exception = __s1;
        if (((sVar1 != local_60.content.size_) ||
            (iVar2 = bcmp(__s1,local_60.content.ptr,sVar1 - 1), iVar2 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[28],capnp::Text::Reader&,capnp::Text::Reader&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(Reader *)&f,&local_70);
        }
        bVar6 = uVar4 < uVar5;
        uVar3 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar6);
    }
    return;
  }
  local_70.super_StringPtr.content.ptr =
       (char *)CONCAT44(local_70.super_StringPtr.content.ptr._4_4_,reader.builder.elementCount);
  local_60._0_8_ = uVar5;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             (unsigned_long *)&local_60,(uint *)&local_70);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}